

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O1

int __thiscall MeCab::anon_unknown_0::ModelImpl::open(ModelImpl *this,char *__file,int __oflag,...)

{
  bool bVar1;
  int iVar2;
  char *str;
  int __oflag_00;
  Param param;
  Param PStack_268;
  
  Param::Param(&PStack_268);
  iVar2 = Param::open(&PStack_268,(char *)((ulong)__file & 0xffffffff),__oflag,
                      (anonymous_namespace)::long_options);
  if ((char)iVar2 != '\0') {
    bVar1 = load_dictionary_resource(&PStack_268);
    if (bVar1) {
      iVar2 = open(this,(char *)&PStack_268,__oflag_00);
      goto LAB_00120784;
    }
  }
  str = whatlog::str(&PStack_268.what_);
  setGlobalError(str);
  iVar2 = 0;
LAB_00120784:
  Param::~Param(&PStack_268);
  return iVar2;
}

Assistant:

bool ModelImpl::open(int argc, char **argv) {
  Param param;
  if (!param.open(argc, argv, long_options) ||
      !load_dictionary_resource(&param)) {
    setGlobalError(param.what());
    return false;
  }
  return open(param);
}